

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutomationBasic.cpp
# Opt level: O2

void __thiscall AutomationBasic::reread(AutomationBasic *this)

{
  _Rb_tree_node_base *__args;
  PolledFile *this_00;
  Mapping *pMVar1;
  pointer pVVar2;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *pvVar3;
  pointer pVVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  Value *this_01;
  reference_wrapper<const_yaml::Mapping> *prVar8;
  reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_> *prVar9;
  long lVar10;
  ulong uVar11;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *prVar12;
  float *pfVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  _Base_ptr p_Var15;
  char *in_RCX;
  int iVar16;
  nfds_t in_RDX;
  pointer this_02;
  uint uVar17;
  string_view sVar18;
  string_view s;
  Keypoint kp;
  Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parsed_float;
  Variable local_1b0;
  ExpectedRef<const_std::string,_std::string> float_string;
  ExpectedRef<const_Sequence,_std::string> sequence;
  ExpectedRef<const_Mapping,_std::string> map;
  Data new_data;
  ExpectedRef<const_Sequence,_std::string> row;
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parsed;
  
  this_00 = (this->source_)._M_t.super___uniq_ptr_impl<PolledFile,_std::default_delete<PolledFile>_>
            ._M_t.super__Tuple_impl<0UL,_PolledFile_*,_std::default_delete<PolledFile>_>.
            super__Head_base<0UL,_PolledFile_*,_false>._M_head_impl;
  uVar17 = this->seq_ + 1;
  this->seq_ = uVar17;
  iVar7 = PolledFile::poll(this_00,(pollfd *)(ulong)uVar17,in_RDX,(int)in_RCX);
  if ((char)iVar7 != '\0') {
    sVar18 = PolledFile::string((this->source_)._M_t.
                                super___uniq_ptr_impl<PolledFile,_std::default_delete<PolledFile>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_PolledFile_*,_std::default_delete<PolledFile>_>
                                .super__Head_base<0UL,_PolledFile_*,_false>._M_head_impl);
    s._M_len = sVar18._M_str;
    s._M_str = in_RCX;
    yaml::parse_abi_cxx11_(&parsed,(yaml *)sVar18._M_len,s);
    if (parsed.has_value_ == false) {
      pbVar14 = Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::error(&parsed);
      aAppDebugPrintf("Automation parsing failed: %s",(pbVar14->_M_dataplus)._M_p);
    }
    else {
      this_01 = Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator->(&parsed);
      yaml::Value::getMapping_abi_cxx11_(&map,this_01);
      if (map.has_value_ == false) {
        pbVar14 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error(&map);
        aAppDebugPrintf("Automation must start with mapping: %s",(pbVar14->_M_dataplus)._M_p);
      }
      else {
        new_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &new_data._M_t._M_impl.super__Rb_tree_header._M_header;
        new_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        new_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        new_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        new_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             new_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        prVar8 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&map);
        pMVar1 = prVar8->_M_data;
        for (p_Var15 = (pMVar1->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var15 != &(pMVar1->map_)._M_t._M_impl.super__Rb_tree_header;
            p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15)) {
          yaml::Value::getSequence_abi_cxx11_(&sequence,(Value *)(p_Var15 + 2));
          __args = p_Var15 + 1;
          if (sequence.has_value_ == false) {
            uVar5 = *(undefined8 *)__args;
            pbVar14 = Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::error(&sequence);
            aAppDebugPrintf("Error parsing %s: %s",uVar5,(pbVar14->_M_dataplus)._M_p);
            Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected(&sequence);
            goto LAB_0010b3ce;
          }
          local_1b0.components = 0;
          local_1b0.sequence.
          super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1b0.sequence.
          super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1b0.sequence.
          super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          prVar9 = Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::value(&sequence);
          pVVar2 = (prVar9->_M_data->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (this_02 = (prVar9->_M_data->
                         super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>)._M_impl.
                         super__Vector_impl_data._M_start; this_02 != pVVar2; this_02 = this_02 + 1)
          {
            yaml::Value::getSequence_abi_cxx11_(&row,this_02);
            if (row.has_value_ == false) {
              uVar5 = *(undefined8 *)__args;
              pbVar14 = Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::error(&row);
              aAppDebugPrintf("Error parsing %s row: %s",uVar5,(pbVar14->_M_dataplus)._M_p);
LAB_0010b2fe:
              Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected(&row);
              goto LAB_0010b303;
            }
            prVar9 = Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value(&row);
            pvVar3 = prVar9->_M_data;
            lVar10 = (long)(pvVar3->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar3->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                           _M_impl.super__Vector_impl_data._M_start;
            uVar11 = lVar10 / 0x70;
            if (uVar11 < 2) {
              aAppDebugPrintf("Error parsing %s row: should be at least [t, x]",
                              *(undefined8 *)__args,lVar10 % 0x70);
              goto LAB_0010b2fe;
            }
            if (5 < uVar11) {
              aAppDebugPrintf("Error parsing %s row: too many components %d, max 4",
                              *(undefined8 *)__args,uVar11 & 0xffffffff);
              goto LAB_0010b2fe;
            }
            iVar16 = (int)uVar11 + -1;
            iVar7 = iVar16;
            if ((local_1b0.components != 0) &&
               (iVar7 = local_1b0.components, local_1b0.components != iVar16)) {
              aAppDebugPrintf("Error parsing %s row: inconsistent number of components %d, %d expected"
                              ,*(undefined8 *)__args);
              goto LAB_0010b2fe;
            }
            local_1b0.components = iVar7;
            kp.row = 0.0;
            kp.value.x = 0.0;
            kp.value.y = 0.0;
            kp.value.z = 0.0;
            kp.value.w = 0.0;
            yaml::Value::getString_abi_cxx11_
                      (&float_string,
                       (pvVar3->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                       _M_impl.super__Vector_impl_data._M_start);
            if (float_string.has_value_ == false) {
              uVar5 = *(undefined8 *)__args;
              pbVar14 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::error(&float_string);
              aAppDebugPrintf("Error parsing %s row time: %s",uVar5,(pbVar14->_M_dataplus)._M_p);
LAB_0010b2f0:
              Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected(&float_string);
              goto LAB_0010b2fe;
            }
            prVar12 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value(&float_string);
            floatFromString(&parsed_float,prVar12->_M_data);
            bVar6 = parsed_float.has_value_;
            if (parsed_float.has_value_ == false) {
              uVar5 = *(undefined8 *)__args;
              pbVar14 = Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::error(&parsed_float);
              aAppDebugPrintf("Error parsing %s row time: %s",uVar5,(pbVar14->_M_dataplus)._M_p);
            }
            else {
              pfVar13 = Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::value(&parsed_float);
              kp.row = *pfVar13;
            }
            Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected(&parsed_float);
            Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected(&float_string);
            if (bVar6 == false) goto LAB_0010b2fe;
            yaml::Value::getString_abi_cxx11_
                      (&float_string,
                       (pvVar3->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
            if (float_string.has_value_ == false) {
              uVar5 = *(undefined8 *)__args;
              pbVar14 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::error(&float_string);
              aAppDebugPrintf("Error parsing %s row x: %s",uVar5,(pbVar14->_M_dataplus)._M_p);
              goto LAB_0010b2f0;
            }
            prVar12 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value(&float_string);
            floatFromString(&parsed_float,prVar12->_M_data);
            bVar6 = parsed_float.has_value_;
            if (parsed_float.has_value_ == false) {
              uVar5 = *(undefined8 *)__args;
              pbVar14 = Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::error(&parsed_float);
              aAppDebugPrintf("Error parsing %s row x: %s",uVar5,(pbVar14->_M_dataplus)._M_p);
            }
            else {
              pfVar13 = Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::value(&parsed_float);
              kp.value.x = *pfVar13;
            }
            Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected(&parsed_float);
            Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected(&float_string);
            if (bVar6 == false) goto LAB_0010b2fe;
            pVVar4 = (pvVar3->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            if (2 < (ulong)(((long)(pvVar3->
                                   super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pVVar4) / 0x70)
               ) {
              yaml::Value::getString_abi_cxx11_(&float_string,pVVar4 + 2);
              if (float_string.has_value_ == false) {
                uVar5 = *(undefined8 *)__args;
                pbVar14 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::error(&float_string);
                aAppDebugPrintf("Error parsing %s row y: %s",uVar5,(pbVar14->_M_dataplus)._M_p);
                goto LAB_0010b2f0;
              }
              prVar12 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::value(&float_string);
              floatFromString(&parsed_float,prVar12->_M_data);
              bVar6 = parsed_float.has_value_;
              if (parsed_float.has_value_ == false) {
                uVar5 = *(undefined8 *)__args;
                pbVar14 = Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::error(&parsed_float);
                aAppDebugPrintf("Error parsing %s row y: %s",uVar5,(pbVar14->_M_dataplus)._M_p);
              }
              else {
                pfVar13 = Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::value(&parsed_float);
                kp.value.y = *pfVar13;
              }
              Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected(&parsed_float);
              Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected(&float_string);
              if (bVar6 == false) goto LAB_0010b2fe;
              pVVar4 = (pvVar3->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if (3 < (ulong)(((long)(pvVar3->
                                     super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pVVar4) /
                             0x70)) {
                yaml::Value::getString_abi_cxx11_(&float_string,pVVar4 + 3);
                if (float_string.has_value_ == false) {
                  uVar5 = *(undefined8 *)__args;
                  pbVar14 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::error(&float_string);
                  aAppDebugPrintf("Error parsing %s row z: %s",uVar5,(pbVar14->_M_dataplus)._M_p);
                  goto LAB_0010b2f0;
                }
                prVar12 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::value(&float_string);
                floatFromString(&parsed_float,prVar12->_M_data);
                bVar6 = parsed_float.has_value_;
                if (parsed_float.has_value_ == false) {
                  uVar5 = *(undefined8 *)__args;
                  pbVar14 = Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::error(&parsed_float);
                  aAppDebugPrintf("Error parsing %s row z: %s",uVar5,(pbVar14->_M_dataplus)._M_p);
                }
                else {
                  pfVar13 = Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::value(&parsed_float);
                  kp.value.z = *pfVar13;
                }
                Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected(&parsed_float);
                Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected(&float_string);
                if (bVar6 == false) goto LAB_0010b2fe;
                pVVar4 = (pvVar3->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                if (4 < (ulong)(((long)(pvVar3->
                                       super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4) /
                               0x70)) {
                  yaml::Value::getString_abi_cxx11_(&float_string,pVVar4 + 4);
                  if (float_string.has_value_ == false) {
                    uVar5 = *(undefined8 *)__args;
                    pbVar14 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::error(&float_string);
                    aAppDebugPrintf("Error parsing %s row w: %s",uVar5,(pbVar14->_M_dataplus)._M_p);
                    goto LAB_0010b2f0;
                  }
                  prVar12 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::value(&float_string);
                  floatFromString(&parsed_float,prVar12->_M_data);
                  bVar6 = parsed_float.has_value_;
                  if (parsed_float.has_value_ == false) {
                    uVar5 = *(undefined8 *)__args;
                    pbVar14 = Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::error(&parsed_float);
                    aAppDebugPrintf("Error parsing %s row w: %s",uVar5,(pbVar14->_M_dataplus)._M_p);
                  }
                  else {
                    pfVar13 = Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::value(&parsed_float);
                    kp.value.w = *pfVar13;
                  }
                  Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~Expected(&parsed_float);
                  Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~Expected(&float_string);
                  if (bVar6 == false) goto LAB_0010b2fe;
                }
              }
            }
            if ((local_1b0.sequence.
                 super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_1b0.sequence.
                 super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               (kp.row < local_1b0.sequence.
                         super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].row)) {
              aAppDebugPrintf("Error parsing %s rows: monotonic time expected",*(undefined8 *)__args
                             );
              goto LAB_0010b2fe;
            }
            std::vector<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>::
            push_back(&local_1b0.sequence,&kp);
            Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected(&row);
          }
          if (local_1b0.sequence.
              super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_1b0.sequence.
              super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,AutomationBasic::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>>
            ::_M_emplace_unique<std::__cxx11::string_const,AutomationBasic::Variable>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,AutomationBasic::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,AutomationBasic::Variable>>>
                        *)&new_data,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,
                       &local_1b0);
          }
LAB_0010b303:
          std::_Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>::
          ~_Vector_base(&local_1b0.sequence.
                         super__Vector_base<AutomationBasic::Keypoint,_std::allocator<AutomationBasic::Keypoint>_>
                       );
          Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected(&sequence);
          if (this_02 != pVVar2) goto LAB_0010b3ce;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
        ::operator=(&(this->data_)._M_t,&new_data._M_t);
LAB_0010b3ce:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AutomationBasic::Variable>_>_>
        ::~_Rb_tree(&new_data._M_t);
      }
      Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(&map);
    }
    Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected(&parsed);
  }
  return;
}

Assistant:

void AutomationBasic::reread() {
	if (!source_->poll(++seq_))
		return;

	auto parsed = yaml::parse(source_->string());
	if (!parsed) {
		MSG("Automation parsing failed: %s", parsed.error().c_str());
		return;
	}
	auto map = parsed->getMapping();
	if (!map) {
		MSG("Automation must start with mapping: %s", map.error().c_str());
		return;
	}

	Data new_data;

	const yaml::Mapping &ymap = map.value();
	for(const auto &kv: ymap.map()) {
		const std::string &var = kv.first;
		auto sequence = kv.second.getSequence();
		if (!sequence) {
			MSG("Error parsing %s: %s", var.c_str(), sequence.error().c_str());
			return;
		}

		Variable variable = {0, {}};

		const yaml::Sequence &yseq = sequence.value();
		for (const auto &it: yseq) {
			auto row = it.getSequence();
			if (!row) {
				MSG("Error parsing %s row: %s", var.c_str(), row.error().c_str());
				return;
			}

			const yaml::Sequence &yrow = row.value();
			if (yrow.size() < 2) {
				MSG("Error parsing %s row: should be at least [t, x]", var.c_str());
				return;
			}

#define READ_FLOAT(i, name, to) \
			do { \
				auto float_string = yrow[i].getString(); \
				if (!float_string) { \
					MSG("Error parsing %s row " #name ": %s", var.c_str(), float_string.error().c_str()); \
					return; \
				} \
				auto parsed_float = floatFromString(float_string.value()); \
				if (!parsed_float) { \
					MSG("Error parsing %s row " #name ": %s", var.c_str(), parsed_float.error().c_str()); \
					return; \
				} \
				to = parsed_float.value(); \
			} while(0)

			if (yrow.size() > 5) {
				MSG("Error parsing %s row: too many components %d, max 4", var.c_str(), static_cast<int>(yrow.size()));
				return;
			}

			const int yrow_components = static_cast<int>(yrow.size() - 1);
			if (variable.components == 0) {
				variable.components = yrow_components;
			} else if (variable.components != yrow_components) {
				MSG("Error parsing %s row: inconsistent number of components %d, %d expected",
					var.c_str(), yrow_components, variable.components);
				return;
			}

			Keypoint kp = {0,{0,0,0,0}};
			READ_FLOAT(0, time, kp.row);
			READ_FLOAT(1, x, kp.value.x);
			if (yrow.size() > 2) READ_FLOAT(2, y, kp.value.y);
			if (yrow.size() > 3) READ_FLOAT(3, z, kp.value.z);
			if (yrow.size() > 4) READ_FLOAT(4, w, kp.value.w);

			if (!variable.sequence.empty() && variable.sequence.back().row > kp.row) {
				MSG("Error parsing %s rows: monotonic time expected", var.c_str());
				return;
			}

			variable.sequence.push_back(kp);
		}

		if (!variable.sequence.empty())
			new_data.emplace(std::move(var), std::move(variable));
	}

	data_ = std::move(new_data);
}